

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O3

bool __thiscall
SecureDataManager::reAuthenticate
          (SecureDataManager *this,ByteString *passphrase,ByteString *encryptedKey)

{
  SymmetricAlgorithm *pSVar1;
  AESKey *pAVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AESKey *pbeKey;
  ByteString local_118;
  ByteString decryptedKeyData;
  ByteString finalBlock;
  ByteString encryptedKeyData;
  ByteString IV;
  ByteString salt;
  
  ByteString::substr(&salt,encryptedKey,0,8);
  iVar4 = (*this->aes->_vptr_SymmetricAlgorithm[0xd])();
  ByteString::substr(&IV,encryptedKey,8,CONCAT44(extraout_var,iVar4));
  iVar4 = (*this->aes->_vptr_SymmetricAlgorithm[0xd])();
  ByteString::substr(&encryptedKeyData,encryptedKey,CONCAT44(extraout_var_00,iVar4) + 8,
                     0xffffffffffffffff);
  pbeKey = (AESKey *)0x0;
  bVar3 = RFC4880::PBEDeriveKey(passphrase,&salt,&pbeKey);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_00161ccc;
  }
  ByteString::ByteString(&decryptedKeyData);
  ByteString::ByteString(&finalBlock);
  pAVar2 = pbeKey;
  pSVar1 = this->aes;
  ByteString::ByteString(&local_118);
  iVar4 = (*pSVar1->_vptr_SymmetricAlgorithm[5])(pSVar1,pAVar2,1,&IV,1,0,&local_118,0);
  if ((char)iVar4 == '\0') {
LAB_00161c7a:
    local_118._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_118.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
LAB_00161c93:
    if (pbeKey != (AESKey *)0x0) {
      (*(pbeKey->super_SymmetricKey).super_Serialisable._vptr_Serialisable[2])();
    }
    bVar3 = false;
  }
  else {
    iVar4 = (*this->aes->_vptr_SymmetricAlgorithm[6])(this->aes,&encryptedKeyData,&decryptedKeyData)
    ;
    if ((char)iVar4 == '\0') goto LAB_00161c7a;
    iVar4 = (*this->aes->_vptr_SymmetricAlgorithm[7])(this->aes,&finalBlock);
    local_118._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_118.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    if ((char)iVar4 == '\0') goto LAB_00161c93;
    if (pbeKey != (AESKey *)0x0) {
      (*(pbeKey->super_SymmetricKey).super_Serialisable._vptr_Serialisable[2])();
    }
    ByteString::operator+=(&decryptedKeyData,&finalBlock);
    ByteString::substr(&local_118,&decryptedKeyData,0,3);
    bVar3 = ByteString::operator!=(&local_118,&this->magic);
    local_118._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_118.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    if (bVar3) {
      bVar3 = false;
      softHSMLog(7,"reAuthenticate",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureDataManager.cpp"
                 ,0x16a,"Incorrect passphrase supplied");
    }
    else {
      bVar3 = true;
      ByteString::wipe(&decryptedKeyData,0);
    }
  }
  finalBlock._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&finalBlock.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  decryptedKeyData._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&decryptedKeyData.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
LAB_00161ccc:
  encryptedKeyData._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&encryptedKeyData.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  IV._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&IV.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  salt._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&salt.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return bVar3;
}

Assistant:

bool SecureDataManager::reAuthenticate(const ByteString& passphrase, const ByteString& encryptedKey)
{
	// First, take the salt from the encrypted key
	ByteString salt = encryptedKey.substr(0,8);

	// Then, take the IV from the encrypted key
	ByteString IV = encryptedKey.substr(8, aes->getBlockSize());

	// Now, take the encrypted data from the encrypted key
	ByteString encryptedKeyData = encryptedKey.substr(8 + aes->getBlockSize());

	// Derive the PBE key
	AESKey* pbeKey = NULL;

	if (!RFC4880::PBEDeriveKey(passphrase, salt, &pbeKey))
	{
		return false;
	}

	// Decrypt the key data
	ByteString decryptedKeyData;
	ByteString finalBlock;

	// NOTE: The login will fail here if incorrect passphrase is supplied
	if (!aes->decryptInit(pbeKey, SymMode::CBC, IV) ||
	    !aes->decryptUpdate(encryptedKeyData, decryptedKeyData) ||
	    !aes->decryptFinal(finalBlock))
	{
		delete pbeKey;

		return false;
	}

	delete pbeKey;

	decryptedKeyData += finalBlock;

	// Check the magic
	if (decryptedKeyData.substr(0, 3) != magic)
	{
		// The passphrase was incorrect
		DEBUG_MSG("Incorrect passphrase supplied");

		return false;
	}

	// And mask the key
	decryptedKeyData.wipe();

	return true;
}